

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  ThreadSafeArena *pTVar1;
  ThreadSafeArena *pTVar2;
  Message *this_00;
  char *failure_msg;
  int line;
  ThreadSafeArena *pTVar3;
  Arena *arena;
  ThreadSafeArena *local_38;
  LogMessage local_30;
  
  if (sub_message == (Message *)0x0) {
    sub_message = (Message *)0x0;
  }
  else {
    pTVar2 = (ThreadSafeArena *)(sub_message->super_MessageLite)._internal_metadata_.ptr_;
    pTVar1 = pTVar2;
    if (((ulong)pTVar2 & 1) != 0) {
      pTVar1 = *(ThreadSafeArena **)((ulong)pTVar2 & 0xfffffffffffffffe);
    }
    if (pTVar1 != (ThreadSafeArena *)0x0) {
      pTVar3 = (ThreadSafeArena *)(message->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pTVar3 & 1) != 0) {
        pTVar3 = *(ThreadSafeArena **)((ulong)pTVar3 & 0xfffffffffffffffe);
      }
      if (pTVar1 != pTVar3) {
        failure_msg = 
        "sub_message == nullptr || sub_message->GetArena() == nullptr || sub_message->GetArena() == message->GetArena()"
        ;
        line = 0x9f2;
        goto LAB_00252d4f;
      }
    }
    local_38 = (ThreadSafeArena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)local_38 & 1) != 0) {
      local_38 = *(ThreadSafeArena **)((ulong)local_38 & 0xfffffffffffffffe);
    }
    if (((ulong)pTVar2 & 1) != 0) {
      pTVar2 = *(ThreadSafeArena **)((ulong)pTVar2 & 0xfffffffffffffffe);
    }
    if (local_38 != pTVar2) {
      if (pTVar2 != (ThreadSafeArena *)0x0) {
        this_00 = MutableMessage(this,message,field,(MessageFactory *)0x0);
        Message::CopyFrom(this_00,sub_message);
        return;
      }
      local_30.errno_saver_.saved_errno_ = 0;
      local_30._4_4_ = 0;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_NEImpl<google::protobuf::Arena*,decltype(nullptr)>
                              ((Arena **)&local_38,(void **)&local_30,"arena != nullptr");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        internal::ThreadSafeArena::AddCleanup
                  (local_38,sub_message,internal::arena_delete_object<google::protobuf::MessageLite>
                  );
        UnsafeArenaSetAllocatedMessage(this,message,sub_message,field);
        return;
      }
      line = 0xa04;
LAB_00252d4f:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,line,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
  }
  UnsafeArenaSetAllocatedMessage(this,message,sub_message,field);
  return;
}

Assistant:

void Reflection::SetAllocatedMessage(Message* message, Message* sub_message,
                                     const FieldDescriptor* field) const {
  ABSL_DCHECK(sub_message == nullptr || sub_message->GetArena() == nullptr ||
              sub_message->GetArena() == message->GetArena());

  if (sub_message == nullptr) {
    UnsafeArenaSetAllocatedMessage(message, nullptr, field);
    return;
  }

  Arena* arena = message->GetArena();
  Arena* sub_arena = sub_message->GetArena();
  if (arena == sub_arena) {
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    return;
  }

  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_arena == nullptr) {
    ABSL_DCHECK_NE(arena, nullptr);
    // Case 1: parent is on an arena and child is heap-allocated. We can add
    // the child to the arena's Own() list to free on arena destruction, then
    // set our pointer.
    arena->Own(sub_message);
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  } else {
    // Case 2: all other cases. We need to make a copy. MutableMessage() will
    // either get the existing message object, or instantiate a new one as
    // appropriate w.r.t. our arena.
    Message* sub_message_copy = MutableMessage(message, field);
    sub_message_copy->CopyFrom(*sub_message);
  }
}